

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs.c
# Opt level: O1

sx__job_select_result sx__job_select(sx_job_context *ctx,uint32_t tid,uint32_t tags)

{
  sx_lock_t sVar1;
  uint32_t uVar2;
  sx__job *psVar3;
  sx__job *psVar4;
  sx__job *psVar5;
  uint uVar6;
  sx_job_t puVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  sx__job_select_result sVar11;
  
  while( true ) {
    LOCK();
    sVar1 = ctx->job_lk;
    ctx->job_lk = 1;
    UNLOCK();
    if (sVar1 == 0) break;
    do {
    } while (ctx->job_lk != 0);
  }
  uVar9 = 0;
  uVar8 = 0;
  psVar4 = (sx__job *)0x0;
  do {
    psVar5 = psVar4;
    psVar3 = ctx->waiting_list[uVar9];
    uVar10 = uVar9;
    if (ctx->waiting_list[uVar9] != (sx__job *)0x0) {
      do {
        psVar5 = psVar3;
        puVar7 = psVar5->wait_counter;
        if (*puVar7 == 0) {
          uVar2 = psVar5->owner_tid;
          puVar7 = (sx_job_t)(ulong)CONCAT31((int3)(uVar2 >> 8),uVar2 != tid);
          if ((uVar2 == 0 || uVar2 == tid) &&
             ((psVar5->tags == 0 ||
              (uVar6 = psVar5->tags & tags, puVar7 = (sx_job_t)(ulong)uVar6, uVar6 != 0)))) {
            psVar4 = psVar5->prev;
            if (psVar4 != (sx__job *)0x0) {
              psVar4->next = psVar5->next;
            }
            psVar3 = psVar5->next;
            if (psVar3 != (sx__job *)0x0) {
              psVar3->prev = psVar4;
            }
            if (ctx->waiting_list[uVar9] == psVar5) {
              ctx->waiting_list[uVar9] = psVar3;
            }
            if (ctx->waiting_list_last[uVar9] == psVar5) {
              ctx->waiting_list_last[uVar9] = psVar5->prev;
            }
            psVar5->next = (sx__job *)0x0;
            psVar5->prev = (sx__job *)0x0;
            uVar10 = 3;
            uVar8 = CONCAT71((int7)((ulong)psVar3 >> 8),1);
            goto LAB_0010c35c;
          }
        }
        psVar3 = psVar5->next;
      } while (psVar5->next != (sx__job *)0x0);
      uVar8 = CONCAT71((int7)((ulong)puVar7 >> 8),1);
      psVar5 = psVar4;
    }
LAB_0010c35c:
    uVar9 = uVar10 + 1;
    psVar4 = psVar5;
    if (1 < (int)uVar10) {
      ctx->job_lk = 0;
      sVar11._8_8_ = uVar8 & 0xffffffff;
      sVar11.job = psVar5;
      return sVar11;
    }
  } while( true );
}

Assistant:

static sx__job_select_result sx__job_select(sx_job_context* ctx, uint32_t tid, uint32_t tags)
{
    sx__job_select_result r = { 0 };
    
    sx_lock(ctx->job_lk) {
        for (int pr = 0; pr < SX_JOB_PRIORITY_COUNT; pr++) {
            sx__job* node = ctx->waiting_list[pr];
            while (node) {
                r.waiting_list_alive = true;
                if (*node->wait_counter == 0) {    // job must not be waiting/depend on any jobs
                    if ((node->owner_tid == 0 || node->owner_tid == tid) &&
                        (node->tags == 0 || (node->tags & tags))) {
                        r.job = node;
                        sx__job_remove_list(&ctx->waiting_list[pr], &ctx->waiting_list_last[pr], node);
                        pr = SX_JOB_PRIORITY_COUNT; // break out of the outer loop
                        break;
                    }
                }
                node = node->next;
            }    // while(iterate nodes)
        }        // foreach(priority)
    } // lock

    return r;
}